

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::NodeRef&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,NodeRef *args,uint *args_1)

{
  uint uVar1;
  pointer pEVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  long lVar9;
  ulong uVar10;
  pointer __src;
  size_type sVar11;
  long lVar12;
  
  pEVar2 = this->data_;
  sVar11 = this->len;
  __src = pEVar2 + sVar11;
  if (sVar11 != this->cap) {
    uVar3 = (args->pip).value;
    uVar1 = *args_1;
    __src->node = (void *)(uVar3 & 0xffffffffffffffc0);
    __src->size = ((uint)uVar3 & 0x3f) + 1;
    __src->offset = uVar1;
    this->len = sVar11 + 1;
    return pEVar2 + sVar11;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar10 = this->len + 1;
  uVar3 = this->cap;
  if (uVar10 < uVar3 * 2) {
    uVar10 = uVar3 * 2;
  }
  if (0x7ffffffffffffff - uVar3 < uVar3) {
    uVar10 = 0x7ffffffffffffff;
  }
  lVar12 = (long)__src - (long)this->data_;
  pEVar6 = (pointer)operator_new(uVar10 << 4);
  uVar3 = (args->pip).value;
  uVar1 = *args_1;
  *(ulong *)((long)pEVar6 + lVar12) = uVar3 & 0xffffffffffffffc0;
  *(uint *)((long)pEVar6 + lVar12 + 8) = ((uint)uVar3 & 0x3f) + 1;
  *(uint *)((long)pEVar6 + lVar12 + 0xc) = uVar1;
  pEVar2 = this->data_;
  sVar11 = this->len;
  lVar9 = (long)pEVar2 + (sVar11 * 0x10 - (long)__src);
  pEVar7 = pEVar2;
  pEVar8 = pEVar6;
  if (lVar9 == 0) {
    pEVar7 = pEVar6;
    pEVar8 = pEVar2;
    if (sVar11 != 0) {
      do {
        uVar4 = pEVar8->size;
        uVar5 = pEVar8->offset;
        pEVar7->node = pEVar8->node;
        pEVar7->size = uVar4;
        pEVar7->offset = uVar5;
        pEVar8 = pEVar8 + 1;
        pEVar7 = pEVar7 + 1;
      } while (pEVar8 != __src);
    }
  }
  else {
    for (; pEVar7 != __src; pEVar7 = pEVar7 + 1) {
      uVar4 = pEVar7->size;
      uVar5 = pEVar7->offset;
      pEVar8->node = pEVar7->node;
      pEVar8->size = uVar4;
      pEVar8->offset = uVar5;
      pEVar8 = pEVar8 + 1;
    }
    memcpy((void *)((long)pEVar6 + lVar12 + 0x10),__src,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10)
    ;
  }
  if (pEVar2 != (pointer)this->firstElement) {
    operator_delete(pEVar2);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar10;
  this->data_ = pEVar6;
  return (reference)((long)pEVar6 + lVar12);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }